

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

void Dar_LibSetup(Dar_Lib_t *p,Vec_Int_t *vOuts,Vec_Int_t *vPrios)

{
  byte bVar1;
  int iVar2;
  Dar_LibObj_t *pDVar3;
  uchar *puVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  size_t __size;
  long lVar15;
  
  if (p->iObj != p->nObjs) {
    __assert_fail("p->iObj == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x121,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  memset(p->nSubgr,0,0x378);
  lVar7 = 0x7dc;
  do {
    p->nSubgr[lVar7 + -4] = 0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x8ba);
  iVar6 = vOuts->nSize;
  if (0 < iVar6) {
    piVar8 = vOuts->pArray;
    pDVar3 = p->pObjs;
    puVar4 = p->pMap;
    lVar7 = 0;
    do {
      uVar13 = (ulong)pDVar3[piVar8[lVar7]] >> 0x24;
      uVar12 = SUB84(pDVar3[piVar8[lVar7]],4) >> 4;
      uVar14 = ~uVar12 & 0xffff;
      if (uVar14 < uVar12) {
        uVar13 = (ulong)uVar14;
      }
      p->nSubgr[puVar4[uVar13]] = p->nSubgr[puVar4[uVar13]] + 1;
      lVar7 = lVar7 + 1;
      iVar6 = vOuts->nSize;
    } while (lVar7 < iVar6);
  }
  piVar8 = (int *)malloc((long)iVar6 << 2);
  p->pSubgrMem = piVar8;
  piVar8 = (int *)malloc((long)iVar6 << 2);
  p->pSubgr0Mem = piVar8;
  p->nSubgrTotal = 0;
  lVar7 = 0;
  do {
    iVar6 = p->nSubgrTotal;
    p->pSubgr[lVar7] = p->pSubgrMem + iVar6;
    p->pSubgr0[lVar7] = p->pSubgr0Mem + iVar6;
    p->nSubgrTotal = p->nSubgr[lVar7] + iVar6;
    p->nSubgr[lVar7] = 0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xde);
  if (p->nSubgrTotal != vOuts->nSize) {
    __assert_fail("p->nSubgrTotal == Vec_IntSize(vOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x138,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar6 = vOuts->nSize;
  if (0 < iVar6) {
    piVar8 = vOuts->pArray;
    pDVar3 = p->pObjs;
    puVar4 = p->pMap;
    lVar7 = 0;
    do {
      iVar6 = piVar8[lVar7];
      uVar13 = (ulong)pDVar3[iVar6] >> 0x24;
      uVar12 = SUB84(pDVar3[iVar6],4) >> 4;
      uVar14 = ~uVar12 & 0xffff;
      if (uVar14 < uVar12) {
        uVar13 = (ulong)uVar14;
      }
      bVar1 = puVar4[uVar13];
      piVar5 = p->pSubgr[bVar1];
      iVar10 = p->nSubgr[bVar1];
      p->nSubgr[bVar1] = iVar10 + 1;
      piVar5[iVar10] = iVar6;
      lVar7 = lVar7 + 1;
      iVar6 = vOuts->nSize;
    } while (lVar7 < iVar6);
  }
  piVar8 = (int *)malloc((long)iVar6 << 2);
  p->pPriosMem = piVar8;
  p->nSubgrTotal = 0;
  lVar7 = 0;
  uVar13 = 0;
  iVar10 = 0;
  do {
    lVar11 = (long)iVar10;
    p->pPrios[lVar7] = piVar8 + lVar11;
    iVar10 = iVar10 + p->nSubgr[lVar7];
    p->nSubgrTotal = iVar10;
    iVar2 = p->nSubgr[lVar7];
    if (0 < (long)iVar2) {
      iVar9 = (int)uVar13;
      lVar15 = 0;
      do {
        if ((iVar9 < 0) || (vPrios->nSize <= iVar9 + (int)lVar15)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        (piVar8 + lVar11)[lVar15] = vPrios->pArray[uVar13 + lVar15];
        lVar15 = lVar15 + 1;
      } while (iVar2 != lVar15);
      uVar13 = (ulong)(uint)(iVar2 + iVar9);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xde);
  if (p->nSubgrTotal != iVar6) {
    __assert_fail("p->nSubgrTotal == Vec_IntSize(vOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x179,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if ((int)uVar13 == vPrios->nSize) {
    if (0 < p->iObj) {
      lVar7 = 0;
      do {
        p->pObjs[lVar7] = (Dar_LibObj_t)((ulong)p->pObjs[lVar7] & 0xfffffffff | 0xff000000000);
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->iObj);
    }
    lVar7 = 0;
    do {
      if (0 < p->nSubgr[lVar7]) {
        lVar11 = 0;
        do {
          Dar_LibSetup_rec(p,p->pObjs + p->pSubgr[lVar7][lVar11],(int)lVar7,0);
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->nSubgr[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xde);
    p->nNodesTotal = 0;
    iVar6 = 0;
    lVar7 = 0x7dc;
    do {
      iVar6 = iVar6 + p->nSubgr[lVar7 + -4];
      p->nNodesTotal = iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x8ba);
    __size = (long)p->nNodesTotal << 2;
    piVar8 = (int *)malloc(__size);
    p->pNodesMem = piVar8;
    piVar8 = (int *)malloc(__size);
    p->pNodes0Mem = piVar8;
    p->nNodesTotal = 0;
    lVar7 = 0x7dc;
    do {
      iVar6 = p->nNodesTotal;
      *(int **)((long)p + lVar7 * 8 + -0x1bf8) = p->pNodesMem + iVar6;
      *(int **)((long)p + lVar7 * 8 + -0x1178) = p->pNodes0Mem + iVar6;
      p->nNodesTotal = p->nSubgr[lVar7 + -4] + iVar6;
      p->nSubgr[lVar7 + -4] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x8ba);
    if (0 < p->iObj) {
      lVar7 = 0;
      do {
        p->pObjs[lVar7] = (Dar_LibObj_t)((ulong)p->pObjs[lVar7] & 0xfffffffff | 0xff000000000);
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->iObj);
    }
    lVar7 = 0;
    iVar6 = 0;
    do {
      if (0 < p->nSubgr[lVar7]) {
        lVar11 = 0;
        do {
          Dar_LibSetup_rec(p,p->pObjs + p->pSubgr[lVar7][lVar11],(int)lVar7,1);
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->nSubgr[lVar7]);
      }
      iVar6 = iVar6 + p->nNodes[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xde);
    if (iVar6 == p->nNodesTotal) {
      lVar7 = 0;
      lVar11 = 0;
      do {
        p->pObjs[lVar11] = (Dar_LibObj_t)(((ulong)p->pObjs[lVar11] & 0xfffffffff) + lVar7);
        lVar11 = lVar11 + 1;
        lVar7 = lVar7 + 0x1000000000;
      } while (lVar11 != 4);
      return;
    }
    __assert_fail("nNodesTotal == p->nNodesTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x19f,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  __assert_fail("Counter == Vec_IntSize(vPrios)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                ,0x17a,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Dar_LibSetup( Dar_Lib_t * p, Vec_Int_t * vOuts, Vec_Int_t * vPrios )
{
    int fTraining = 0;
    Dar_LibObj_t * pObj;
    int nNodesTotal, uTruth, Class, Out, i, k;
    assert( p->iObj == p->nObjs );

    // count the number of representatives of each class
    for ( i = 0; i < 222; i++ )
        p->nSubgr[i] = p->nNodes[i] = 0;
    Vec_IntForEachEntry( vOuts, Out, i )
    {
        pObj = Dar_LibObj( p, Out );
        uTruth = Dar_LibObjTruth( pObj );
        Class = p->pMap[uTruth];
        p->nSubgr[Class]++;
    }
    // allocate memory for the roots of each class
    p->pSubgrMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
    p->pSubgr0Mem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
    p->nSubgrTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
        p->pSubgr[i] = p->pSubgrMem + p->nSubgrTotal;
        p->pSubgr0[i] = p->pSubgr0Mem + p->nSubgrTotal;
        p->nSubgrTotal += p->nSubgr[i];
        p->nSubgr[i] = 0;
    }
    assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
    // add the outputs to storage
    Vec_IntForEachEntry( vOuts, Out, i )
    {
        pObj = Dar_LibObj( p, Out );
        uTruth = Dar_LibObjTruth( pObj );
        Class = p->pMap[uTruth];
        p->pSubgr[Class][ p->nSubgr[Class]++ ] = Out;
    }

    if ( fTraining )
    {
        // allocate memory for the priority of roots of each class
        p->pPriosMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPrios[i] = p->pPriosMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPrios[i][k] = k;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );

        // allocate memory for the priority of roots of each class
        p->pPlaceMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPlace[i] = p->pPlaceMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPlace[i][k] = k;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );

        // allocate memory for the priority of roots of each class
        p->pScoreMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pScore[i] = p->pScoreMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pScore[i][k] = 0;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
    }
    else
    {
        int Counter = 0;
        // allocate memory for the priority of roots of each class
        p->pPriosMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPrios[i] = p->pPriosMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPrios[i][k] = Vec_IntEntry(vPrios, Counter++);

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
        assert( Counter == Vec_IntSize(vPrios) );
    }

    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // count nodes in each class
    for ( i = 0; i < 222; i++ )
        for ( k = 0; k < p->nSubgr[i]; k++ )
            Dar_LibSetup_rec( p, Dar_LibObj(p, p->pSubgr[i][k]), i, 0 );
    // count the total number of nodes
    p->nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
        p->nNodesTotal += p->nNodes[i];
    // allocate memory for the nodes of each class
    p->pNodesMem = ABC_ALLOC( int, p->nNodesTotal );
    p->pNodes0Mem = ABC_ALLOC( int, p->nNodesTotal );
    p->nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
        p->pNodes[i] = p->pNodesMem + p->nNodesTotal;
        p->pNodes0[i] = p->pNodes0Mem + p->nNodesTotal;
        p->nNodesTotal += p->nNodes[i];
        p->nNodes[i] = 0;
    }
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // add the nodes to storage
    nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
         for ( k = 0; k < p->nSubgr[i]; k++ )
            Dar_LibSetup_rec( p, Dar_LibObj(p, p->pSubgr[i][k]), i, 1 );
         nNodesTotal += p->nNodes[i];
//printf( "Class %3d : Subgraphs = %4d. Nodes = %5d.\n", i, p->nSubgr[i], p->nNodes[i] );
    }
    assert( nNodesTotal == p->nNodesTotal );
     // prepare the number of the PI nodes
    for ( i = 0; i < 4; i++ )
        Dar_LibObj(p, i)->Num = i;
}